

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void ThreadPool::_workerThread(ThreadPool *pool,size_t threadId)

{
  atomic<unsigned_long> *paVar1;
  mutex *__mutex;
  list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *this;
  __int_type _Var2;
  _List_node_base *p_Var3;
  AbstractTaskProvider *this_00;
  unique_lock<std::mutex> _mutexLock;
  
  LOCK();
  paVar1 = &pool->_runningThreadCount;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (_Var2 + 1 == pool->_threadCount) {
    std::mutex::lock(&pool->_creation);
    pool->_threadsCreated = true;
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)&pool->_creation);
  }
  __mutex = &pool->_taskInfo;
  this = &pool->_task;
  do {
    if ((pool->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[threadId] != '\0') {
LAB_0012aed6:
      LOCK();
      (pool->_runningThreadCount).super___atomic_base<unsigned_long>._M_i =
           (pool->_runningThreadCount).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      return;
    }
    std::unique_lock<std::mutex>::unique_lock(&_mutexLock,__mutex);
    while ((pool->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[threadId] == '\0') {
      std::condition_variable::wait((unique_lock *)&pool->_waiting);
    }
    std::unique_lock<std::mutex>::unlock(&_mutexLock);
    if ((pool->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[threadId] != '\0') {
      std::unique_lock<std::mutex>::~unique_lock(&_mutexLock);
      goto LAB_0012aed6;
    }
    std::mutex::lock(__mutex);
    p_Var3 = (this->
             super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)this) {
      (pool->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[threadId] = '\0';
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      this_00 = (AbstractTaskProvider *)p_Var3[1]._M_next;
      std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::pop_front
                (this);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      AbstractTaskProvider::_taskRun(this_00,false);
    }
    std::unique_lock<std::mutex>::~unique_lock(&_mutexLock);
  } while( true );
}

Assistant:

void ThreadPool::_workerThread( ThreadPool * pool, size_t threadId )
{
    if( ++(pool->_runningThreadCount) == pool->_threadCount ) {
        pool->_creation.lock();
        pool->_threadsCreated = true;
        pool->_completeCreation.notify_one();
        pool->_creation.unlock();
    }

    while( !pool->_exit[threadId] ) {
        std::unique_lock < std::mutex > _mutexLock( pool->_taskInfo );
        pool->_waiting.wait( _mutexLock, [&] { return pool->_run[threadId]; } );
        _mutexLock.unlock();

        if( pool->_exit[threadId] )
            break;

        pool->_taskInfo.lock();

        if( !pool->_task.empty() ) {
            AbstractTaskProvider * task = pool->_task.front();

            pool->_task.pop_front();

            pool->_taskInfo.unlock();

            task->_taskRun( false );
        }
        else {
            pool->_run[threadId] = 0;

            pool->_taskInfo.unlock();
        }
    }

    --(pool->_runningThreadCount);
}